

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

int32_t ucnv_extSimpleMatchFromU_63(int32_t *cx,UChar32 cp,uint32_t *pValue,UBool useFallback)

{
  int32_t iVar1;
  uint local_40;
  int isRoundtrip;
  int32_t length;
  int32_t match;
  uint32_t value;
  UBool useFallback_local;
  uint32_t *pValue_local;
  int32_t *piStack_18;
  UChar32 cp_local;
  int32_t *cx_local;
  
  match._3_1_ = useFallback;
  _value = pValue;
  pValue_local._4_4_ = cp;
  piStack_18 = cx;
  iVar1 = ucnv_extMatchFromU(cx,cp,(UChar *)0x0,0,(UChar *)0x0,0,(uint32_t *)&length,useFallback,
                             '\x01');
  if (1 < iVar1) {
    local_40 = (uint)length >> 0x18 & 0x1f;
    if (local_40 < 4) {
      *_value = length & 0xffffff;
      if ((length & 0x80000000U) == 0) {
        local_40 = -local_40;
      }
      return local_40;
    }
  }
  return 0;
}

Assistant:

U_CFUNC int32_t
ucnv_extSimpleMatchFromU(const int32_t *cx,
                         UChar32 cp, uint32_t *pValue,
                         UBool useFallback) {
    uint32_t value;
    int32_t match;

    /* try to match */
    match=ucnv_extMatchFromU(cx,
                             cp,
                             NULL, 0,
                             NULL, 0,
                             &value,
                             useFallback, TRUE);
    if(match>=2) {
        /* write result for simple, single-character conversion */
        int32_t length;
        int isRoundtrip;

        isRoundtrip=UCNV_EXT_FROM_U_IS_ROUNDTRIP(value);
        length=UCNV_EXT_FROM_U_GET_LENGTH(value);
        value=(uint32_t)UCNV_EXT_FROM_U_GET_DATA(value);

        if(length<=UCNV_EXT_FROM_U_MAX_DIRECT_LENGTH) {
            *pValue=value;
            return isRoundtrip ? length : -length;
#if 0 /* not currently used */
        } else if(length==4) {
            /* de-serialize a 4-byte result */
            const uint8_t *result=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_BYTES_INDEX, uint8_t)+value;
            *pValue=
                ((uint32_t)result[0]<<24)|
                ((uint32_t)result[1]<<16)|
                ((uint32_t)result[2]<<8)|
                result[3];
            return isRoundtrip ? 4 : -4;
#endif
        }
    }

    /*
     * return no match because
     * - match>1 && resultLength>4: result too long for simple conversion
     * - match==1: no match found, <subchar1> preferred
     * - match==0: no match found in the first place
     * - match<0: partial match, not supported for simple conversion (and flush==TRUE)
     */
    return 0;
}